

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

char * pathcat(char *prefix,char *path)

{
  size_t sVar1;
  char *__dest;
  int *piVar2;
  size_t local_38;
  size_t len;
  size_t prelen;
  char *str;
  char *path_local;
  char *prefix_local;
  
  if (prefix == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = strlen(prefix);
    local_38 = local_38 + 1;
  }
  sVar1 = strlen(path);
  __dest = (char *)malloc(local_38 + sVar1 + 1);
  if (__dest == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xc;
    error("malloc()");
  }
  if (prefix != (char *)0x0) {
    memcpy(__dest,prefix,local_38);
    __dest[local_38 - 1] = '/';
  }
  memcpy(__dest + local_38,path,sVar1 + 1);
  return __dest;
}

Assistant:

static char *
pathcat(const char *prefix, const char *path)
{
	char *str;
	size_t prelen, len;

	prelen = prefix ? strlen(prefix) + 1 : 0;
	len = strlen(path) + 1;
	if ((str = malloc(prelen + len)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	if (prefix) {
		memcpy(str, prefix, prelen);	/* includes zero */
		str[prelen - 1] = '/';		/* splat zero */
	}
	memcpy(str + prelen, path, len);	/* includes zero */

	return (str);
}